

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EllipsoidRecord1.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::EllipsoidRecord1::Encode(EllipsoidRecord1 *this,KDataStream *stream)

{
  KDataStream::Write<unsigned_int>(stream,(this->super_EnvironmentRecord).m_ui32EnvRecTyp);
  KDataStream::Write<unsigned_short>(stream,(this->super_EnvironmentRecord).m_ui16Length);
  KDataStream::Write(stream,(this->super_EnvironmentRecord).m_ui8Index);
  KDataStream::Write(stream,(this->super_EnvironmentRecord).m_ui8Padding);
  (*(this->m_CentLocation).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_CentLocation,stream);
  (*(this->m_Sigma).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Sigma,stream);
  (*(this->m_Ori).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Ori,stream);
  return;
}

Assistant:

void EllipsoidRecord1::Encode( KDataStream & stream ) const
{
    stream << m_ui32EnvRecTyp
           << m_ui16Length
           << m_ui8Index
           << m_ui8Padding
           << KDIS_STREAM m_CentLocation
           << KDIS_STREAM m_Sigma
           << KDIS_STREAM m_Ori;
}